

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ec_asn1.cc
# Opt level: O2

int eckey_priv_decode(EVP_PKEY *out,CBS *params,CBS *key)

{
  EC_GROUP *group;
  EC_KEY *key_00;
  int iVar1;
  
  group = EC_KEY_parse_parameters(params);
  if ((group == (EC_GROUP *)0x0) || (params->len != 0)) {
    iVar1 = 0;
    ERR_put_error(6,0,0x66,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_ec_asn1.cc"
                  ,0x5c);
  }
  else {
    key_00 = EC_KEY_parse_private_key(key,group);
    if ((key_00 == (EC_KEY *)0x0) || (key->len != 0)) {
      iVar1 = 0;
      ERR_put_error(6,0,0x66,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_ec_asn1.cc"
                    ,0x62);
      EC_KEY_free((EC_KEY *)key_00);
    }
    else {
      EVP_PKEY_assign_EC_KEY(out,key_00);
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

static int eckey_priv_decode(EVP_PKEY *out, CBS *params, CBS *key) {
  // See RFC 5915.
  const EC_GROUP *group = EC_KEY_parse_parameters(params);
  if (group == NULL || CBS_len(params) != 0) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
    return 0;
  }

  EC_KEY *ec_key = EC_KEY_parse_private_key(key, group);
  if (ec_key == NULL || CBS_len(key) != 0) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
    EC_KEY_free(ec_key);
    return 0;
  }

  EVP_PKEY_assign_EC_KEY(out, ec_key);
  return 1;
}